

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglColorClearTests.cpp
# Opt level: O1

void deqp::egl::createColorClearGroups<deqp::egl::SingleThreadColorClearCase>
               (EglTestContext *eglTestCtx,TestCaseGroup *group,ColorClearGroupSpec *first,
               ColorClearGroupSpec *last)

{
  TestNode *node;
  TestNode *node_00;
  pointer filters;
  FilterList baseFilters;
  vector<deqp::egl::RenderFilterList,_std::allocator<deqp::egl::RenderFilterList>_> filterLists;
  
  if (first != last) {
    do {
      node = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)node,eglTestCtx->m_testCtx,first->name,first->desc);
      tcu::TestNode::addChild(&group->super_TestNode,node);
      filterLists.
      super__Vector_base<deqp::egl::RenderFilterList,_std::allocator<deqp::egl::RenderFilterList>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      filterLists.
      super__Vector_base<deqp::egl::RenderFilterList,_std::allocator<deqp::egl::RenderFilterList>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      filterLists.
      super__Vector_base<deqp::egl::RenderFilterList,_std::allocator<deqp::egl::RenderFilterList>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      baseFilters.m_rules.
      super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      baseFilters.m_rules.
      super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      baseFilters.m_rules.
      super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      eglu::FilterList::operator<<(&baseFilters,first->baseFilter);
      getDefaultRenderFilterLists(&filterLists,&baseFilters);
      for (filters = filterLists.
                     super__Vector_base<deqp::egl::RenderFilterList,_std::allocator<deqp::egl::RenderFilterList>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          filters !=
          filterLists.
          super__Vector_base<deqp::egl::RenderFilterList,_std::allocator<deqp::egl::RenderFilterList>_>
          ._M_impl.super__Vector_impl_data._M_finish; filters = filters + 1) {
        node_00 = (TestNode *)operator_new(200);
        SingleThreadColorClearCase::SingleThreadColorClearCase
                  ((SingleThreadColorClearCase *)node_00,eglTestCtx,
                   (filters->super_NamedFilterList).m_name._M_dataplus._M_p,"",first->apiBits,
                   filters->m_surfaceTypeMask,(FilterList *)filters,first->numContextsPerApi);
        tcu::TestNode::addChild(node,node_00);
      }
      if (baseFilters.m_rules.
          super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(baseFilters.m_rules.
                        super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)baseFilters.m_rules.
                              super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)baseFilters.m_rules.
                              super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      std::vector<deqp::egl::RenderFilterList,_std::allocator<deqp::egl::RenderFilterList>_>::
      ~vector(&filterLists);
      first = first + 1;
    } while (first != last);
  }
  return;
}

Assistant:

static void createColorClearGroups (EglTestContext& eglTestCtx, tcu::TestCaseGroup* group, const ColorClearGroupSpec* first, const ColorClearGroupSpec* last)
{
	for (const ColorClearGroupSpec* groupIter = first; groupIter != last; groupIter++)
	{
		tcu::TestCaseGroup* configGroup = new tcu::TestCaseGroup(eglTestCtx.getTestContext(), groupIter->name, groupIter->desc);
		group->addChild(configGroup);

		vector<RenderFilterList>	filterLists;
		eglu::FilterList			baseFilters;
		baseFilters << groupIter->baseFilter;
		getDefaultRenderFilterLists(filterLists, baseFilters);

		for (vector<RenderFilterList>::const_iterator listIter = filterLists.begin(); listIter != filterLists.end(); listIter++)
			configGroup->addChild(new ClearClass(eglTestCtx, listIter->getName(), "", groupIter->apiBits, listIter->getSurfaceTypeMask(), *listIter, groupIter->numContextsPerApi));
	}
}